

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O0

void tinyusdz::(anonymous_namespace)::_EncodeNHelper<4,int_const*>
               (int **cur,value_type_conflict7 commonValue,type *prevVal,char **codesOut,
               char **vintsOut)

{
  int *piVar1;
  type_conflict7 tVar2;
  int x;
  Code CVar3;
  char *pcVar4;
  Code code;
  SInt val;
  int i;
  uint8_t codeByte;
  char **ppcStack_30;
  anon_class_4_1_9e4fdca6 getCode;
  char **vintsOut_local;
  char **codesOut_local;
  type *prevVal_local;
  value_type_conflict7 commonValue_local;
  int **cur_local;
  
  val._3_1_ = 0;
  i = commonValue;
  ppcStack_30 = vintsOut;
  for (code = Common; code != 4; code = code + Small) {
    tVar2 = anon_unknown_0::_Signed<int>(**cur);
    x = tVar2 - *prevVal;
    piVar1 = *cur;
    *cur = piVar1 + 1;
    tVar2 = anon_unknown_0::_Signed<int>(*piVar1);
    *prevVal = tVar2;
    CVar3 = anon_unknown_0::_EncodeNHelper<4,_const_int_*>::anon_class_4_1_9e4fdca6::operator()
                      ((anon_class_4_1_9e4fdca6 *)&i,x);
    val._3_1_ = val._3_1_ | (byte)(CVar3 << ((undefined1)code * '\x02' & 0x1fU));
    switch(CVar3) {
    default:
      break;
    case Small:
      pcVar4 = anon_unknown_0::_WriteBits<signed_char>(*ppcStack_30,(char)x);
      *ppcStack_30 = pcVar4;
      break;
    case Medium:
      pcVar4 = anon_unknown_0::_WriteBits<short>(*ppcStack_30,(short)x);
      *ppcStack_30 = pcVar4;
      break;
    case Large:
      pcVar4 = *ppcStack_30;
      tVar2 = anon_unknown_0::_Signed<int>(x);
      pcVar4 = anon_unknown_0::_WriteBits<int>(pcVar4,tVar2);
      *ppcStack_30 = pcVar4;
    }
  }
  pcVar4 = anon_unknown_0::_WriteBits<unsigned_char>(*codesOut,val._3_1_);
  *codesOut = pcVar4;
  return;
}

Assistant:

void _EncodeNHelper(
    Iterator &cur,
    typename std::iterator_traits<Iterator>::value_type commonValue,
    typename std::make_signed<
        typename std::iterator_traits<Iterator>::value_type
    >::type &prevVal,
    char *&codesOut,
    char *&vintsOut) {

    using Int = typename std::iterator_traits<Iterator>::value_type;
    using SInt = typename std::make_signed<Int>::type;
    using SmallInt = typename _SmallTypes<Int>::SmallInt;
    using MediumInt = typename _SmallTypes<Int>::MediumInt;

    static_assert(1 <= N && N <= 4, "");

    enum Code { Common, Small, Medium, Large };
    
    auto getCode = [commonValue](SInt x) {
        std::numeric_limits<SmallInt> smallLimit;
        std::numeric_limits<MediumInt> mediumLimit;
        if (x == _Signed(commonValue)) { return Common; }
        if (x >= smallLimit.min() && x <= smallLimit.max()) { return Small; }
        if (x >= mediumLimit.min() && x <= mediumLimit.max()) { return Medium; }
        return Large;
    };

    uint8_t codeByte = 0;
    for (int i = 0; i != N; ++i) {
        SInt val = _Signed(*cur) - prevVal;
        prevVal = _Signed(*cur++);
        Code code = getCode(val);
        codeByte |= (code << (2 * i));
        switch (code) {
        default:
        case Common:
            break;
        case Small:
            vintsOut = _WriteBits(vintsOut, static_cast<SmallInt>(val));
            break;
        case Medium:
            vintsOut = _WriteBits(vintsOut, static_cast<MediumInt>(val));
            break;
        case Large:
            vintsOut = _WriteBits(vintsOut, _Signed(val));
            break;
        };
    }
    codesOut = _WriteBits(codesOut, codeByte);
}